

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall
amrex::EB2::Level::fillEdgeCent(Level *this,Array<MultiFab_*,_3> *a_edgecent,Geometry *geom)

{
  int dst_nghost;
  int num_comp;
  FabArray<amrex::FArrayBox> *this_00;
  element_type *peVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer ppVar5;
  pointer pIVar6;
  int i;
  IndexType typ;
  pointer ppVar7;
  uint uVar8;
  long lVar9;
  int idim;
  long lVar10;
  long lVar11;
  long lVar12;
  pointer v;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  _Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_170;
  Array4<double> local_158;
  Box local_114;
  IntVect local_f8;
  MFIter mfi;
  
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&a_edgecent->_M_elems[lVar10]->super_FabArray<amrex::FArrayBox>,1.0);
  }
  if (this->m_allregular == false) {
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      this_00 = &a_edgecent->_M_elems[lVar10]->super_FabArray<amrex::FArrayBox>;
      dst_nghost = (this_00->super_FabArrayBase).n_grow.vect[0];
      num_comp = (this_00->super_FabArrayBase).n_comp;
      local_f8.vect = (int  [3])Geometry::periodicity(geom);
      FabArray<amrex::FArrayBox>::ParallelCopy
                (this_00,&(this->m_edgecent)._M_elems[lVar10].super_FabArray<amrex::FArrayBox>,0,0,
                 num_comp,0,dst_nghost,(Periodicity *)&local_f8,COPY);
      peVar1 = (this->m_covered_grids).m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start !=
          *(pointer *)
           ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data + 8)) {
        local_f8.vect = (int  [3])Geometry::periodicity(geom);
        Periodicity::shiftIntVect
                  ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_170,
                   (Periodicity *)&local_f8);
        typ = BATransformer::index_type(&(this_00->super_FabArrayBase).boxarray.m_bat);
        convert((BoxArray *)&local_f8,&this->m_covered_grids,typ);
        isects.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        isects.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        isects.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        MFIter::MFIter(&mfi,&this_00->super_FabArrayBase,'\0');
        while (mfi.currentIndex < mfi.endIndex) {
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_158,this_00,&mfi);
          MFIter::fabbox(&local_114,&mfi);
          pIVar6 = local_170._M_impl.super__Vector_impl_data._M_finish;
          for (v = local_170._M_impl.super__Vector_impl_data._M_start; v != pIVar6; v = v + 1) {
            r.bigend.vect[1] = local_114.bigend.vect[1];
            r.bigend.vect[2] = local_114.bigend.vect[2];
            r.btype.itype = local_114.btype.itype;
            r.smallend.vect[0] = local_114.smallend.vect[0];
            r.smallend.vect[1] = local_114.smallend.vect[1];
            r.smallend.vect[2] = local_114.smallend.vect[2];
            r.bigend.vect[0] = local_114.bigend.vect[0];
            Box::operator+=(&r,v);
            BoxArray::intersections((BoxArray *)&local_f8,&r,&isects);
            ppVar5 = isects.
                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar7 = isects.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar5;
                ppVar7 = ppVar7 + 1) {
              r.smallend.vect._0_8_ = *(undefined8 *)(ppVar7->second).smallend.vect;
              uVar2 = *(undefined8 *)((ppVar7->second).smallend.vect + 2);
              r._20_8_ = *(undefined8 *)((ppVar7->second).bigend.vect + 2);
              r.bigend.vect[1] = (int)((ulong)*(undefined8 *)(ppVar7->second).bigend.vect >> 0x20);
              r.smallend.vect[2] = (int)uVar2;
              r.bigend.vect[0] = (int)((ulong)uVar2 >> 0x20);
              Box::operator-=(&r,v);
              auVar4 = _DAT_00601800;
              auVar3 = _DAT_006017f0;
              uVar8 = r.bigend.vect[0] - r.smallend.vect[0];
              auVar14._4_4_ = 0;
              auVar14._0_4_ = uVar8;
              auVar14._8_4_ = uVar8;
              auVar14._12_4_ = 0;
              auVar14 = auVar14 ^ _DAT_00601800;
              for (lVar12 = (long)r.smallend.vect[2]; (int)lVar12 <= r.bigend.vect[2];
                  lVar12 = lVar12 + 1) {
                lVar11 = (long)local_158.p +
                         (lVar12 - local_158.begin.z) * local_158.kstride * 8 +
                         ((long)r.smallend.vect[1] - (long)local_158.begin.y) *
                         local_158.jstride * 8 + (long)local_158.begin.x * -8 +
                         (long)r.smallend.vect[0] * 8 + 8;
                for (lVar9 = (long)r.smallend.vect[1]; lVar9 <= r.bigend.vect[1]; lVar9 = lVar9 + 1)
                {
                  if (r.smallend.vect[0] <= r.bigend.vect[0]) {
                    uVar13 = 0;
                    do {
                      auVar15._8_4_ = (int)uVar13;
                      auVar15._0_8_ = uVar13;
                      auVar15._12_4_ = (int)(uVar13 >> 0x20);
                      auVar15 = (auVar15 | auVar3) ^ auVar4;
                      if ((bool)(~(auVar14._4_4_ < auVar15._4_4_ ||
                                  auVar14._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar14._4_4_) &
                                1)) {
                        *(undefined8 *)(lVar11 + -8 + uVar13 * 8) = 0xbff0000000000000;
                      }
                      if (auVar15._12_4_ <= auVar14._12_4_ &&
                          (auVar15._8_4_ <= auVar14._8_4_ || auVar15._12_4_ != auVar14._12_4_)) {
                        *(undefined8 *)(lVar11 + uVar13 * 8) = 0xbff0000000000000;
                      }
                      uVar13 = uVar13 + 2;
                    } while (((ulong)uVar8 + 2 & 0xfffffffffffffffe) != uVar13);
                  }
                  lVar11 = lVar11 + local_158.jstride * 8;
                }
              }
            }
          }
          MFIter::operator++(&mfi);
        }
        MFIter::~MFIter(&mfi);
        std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ::~_Vector_base(&isects.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       );
        BoxArray::~BoxArray((BoxArray *)&local_f8);
        std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base
                  (&local_170);
      }
    }
  }
  return;
}

Assistant:

void
Level::fillEdgeCent (Array<MultiFab*,AMREX_SPACEDIM> const& a_edgecent, const Geometry& geom) const
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        a_edgecent[idim]->setVal(1.0);
    }
    if (!isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            auto& edgecent = *a_edgecent[idim];
            a_edgecent[idim]->ParallelCopy(m_edgecent[idim],0,0,edgecent.nComp(),
                                           0,edgecent.nGrow(),geom.periodicity());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            if (!m_covered_grids.empty())
            {
                const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();
                BoxArray const& covered_edge_grids = amrex::convert(m_covered_grids,
                                                                    edgecent.ixType());
                std::vector<std::pair<int,Box> > isects;
                for (MFIter mfi(edgecent); mfi.isValid(); ++mfi)
                {
                    auto const& fab = edgecent.array(mfi);
                    const Box& bx = mfi.fabbox();
                    for (const auto& iv : pshifts)
                    {
                        covered_edge_grids.intersections(bx+iv, isects);
                        for (const auto& is : isects) {
                            Box const& ibox = is.second-iv;
                            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(ibox, i, j, k,
                            {
                                fab(i,j,k) = Real(-1.0);  // covered edges
                            });
                        }
                    }
                }
            }
        }
    }
}